

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Jupiter::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Data *pDVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long lVar5;
  ulong uVar4;
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  uVar2 = socket(*(int *)(lVar5 + 4),this->m_data->sockType,this->m_data->sockProto);
  uVar4 = (ulong)uVar2;
  pDVar1 = this->m_data;
  pDVar1->rawSock = uVar2;
  if (uVar2 == 0xffffffff) {
LAB_00137b68:
    iVar3 = 0;
  }
  else {
    if ((pDVar1->sockType != 3) && (pDVar1->sockProto != 0xff)) {
      uVar2 = ::connect(uVar2,*(sockaddr **)(lVar5 + 0x18),*(socklen_t *)(lVar5 + 0x10));
      uVar4 = (ulong)uVar2;
      if (uVar2 == 0xffffffff) goto LAB_00137b68;
    }
    iVar3 = (int)CONCAT71((int7)(uVar4 >> 8),1);
  }
  return iVar3;
}

Assistant:

bool Jupiter::Socket::connect(addrinfo *info) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init()) {
		return false;
	}
#endif // _WIN32

	m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
	
	if (m_data->rawSock == INVALID_SOCKET
		|| (m_data->sockType != SOCK_RAW && m_data->sockProto != IPPROTO_RAW && ::connect(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR))
		return false;

	return true;
}